

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# moc_QSaveFileLineEdit.cpp
# Opt level: O1

int __thiscall QSaveFileLineEdit::qt_metacall(QSaveFileLineEdit *this,Call _c,int _id,void **_a)

{
  int _id_00;
  
  _id_00 = QAbstractButtonLineEdit::qt_metacall(&this->super_QAbstractButtonLineEdit,_c,_id,_a);
  if ((-1 < _id_00) && (_c < (BindableProperty|ReadProperty))) {
    if ((0x14eU >> (_c & 0x1f) & 1) == 0) {
      if (_c == InvokeMetaMethod) {
        if (_id_00 < 2) {
          qt_static_metacall((QObject *)this,InvokeMetaMethod,_id_00,_a);
        }
      }
      else {
        if (_c != RegisterMethodArgumentMetaType) {
          return _id_00;
        }
        if (_id_00 < 2) {
          *(undefined8 *)*_a = 0;
        }
      }
      _id_00 = _id_00 + -2;
    }
    else {
      qt_static_metacall((QObject *)this,_c,_id_00,_a);
      _id_00 = _id_00 + -6;
    }
  }
  return _id_00;
}

Assistant:

int QSaveFileLineEdit::qt_metacall(QMetaObject::Call _c, int _id, void **_a)
{
    _id = QAbstractButtonLineEdit::qt_metacall(_c, _id, _a);
    if (_id < 0)
        return _id;
    if (_c == QMetaObject::InvokeMetaMethod) {
        if (_id < 2)
            qt_static_metacall(this, _c, _id, _a);
        _id -= 2;
    } else if (_c == QMetaObject::RegisterMethodArgumentMetaType) {
        if (_id < 2)
            *reinterpret_cast<QMetaType *>(_a[0]) = QMetaType();
        _id -= 2;
    }
#ifndef QT_NO_PROPERTIES
    else if (_c == QMetaObject::ReadProperty || _c == QMetaObject::WriteProperty
            || _c == QMetaObject::ResetProperty || _c == QMetaObject::BindableProperty
            || _c == QMetaObject::RegisterPropertyMetaType) {
        qt_static_metacall(this, _c, _id, _a);
        _id -= 6;
    }
#endif // QT_NO_PROPERTIES
    return _id;
}